

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optCompare_nulloptOptEmpty_Test::~optCompare_nulloptOptEmpty_Test
          (optCompare_nulloptOptEmpty_Test *this)

{
  optCompare_nulloptOptEmpty_Test *this_local;
  
  ~optCompare_nulloptOptEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(optCompare, nulloptOptEmpty)
{
  using opt_int = opt<int, opt_null_value_policy<int, -1>>;
  opt_int i;
  EXPECT_TRUE(nullopt == i);
  EXPECT_FALSE(nullopt != i);
  EXPECT_FALSE(nullopt < i);
  EXPECT_FALSE(nullopt > i);
  EXPECT_TRUE(nullopt <= i);
  EXPECT_TRUE(nullopt >= i);
}